

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

string * SimpleLogger::replaceString
                   (string *__return_storage_ptr__,string *src_str,string *before,string *after)

{
  long lVar1;
  ulong uVar2;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  uVar2 = 0;
  lVar1 = std::__cxx11::string::find((char *)src_str,(ulong)(before->_M_dataplus)._M_p,0);
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)src_str);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(after->_M_dataplus)._M_p)
    ;
    uVar2 = lVar1 + before->_M_string_length;
    lVar1 = std::__cxx11::string::find((char *)src_str,(ulong)(before->_M_dataplus)._M_p,uVar2);
  }
  if (uVar2 < src_str->_M_string_length) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)src_str);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleLogger::replaceString( const std::string& src_str,
                                         const std::string& before,
                                         const std::string& after )
{
    size_t last = 0;
    size_t pos = src_str.find(before, last);
    std::string ret;
    while (pos != std::string::npos) {
        ret += src_str.substr(last, pos - last);
        ret += after;
        last = pos + before.size();
        pos = src_str.find(before, last);
    }
    if (last < src_str.size()) {
        ret += src_str.substr(last);
    }
    return ret;
}